

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O1

void __thiscall
soplex::SPxLPBase<double>::added2Set
          (SPxLPBase<double> *this,SVSetBase<double> *set,SVSetBase<double> *addset,int n)

{
  int iVar1;
  Item *pIVar2;
  DataKey *pDVar3;
  Item *pIVar4;
  DataKey *pDVar5;
  Nonzero<double> *pNVar6;
  int *piVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  int *piVar13;
  int newmax;
  DataArray<int> moreArray;
  int *local_40;
  undefined8 local_38;
  
  if (n != 0) {
    iVar1 = (set->set).thenum;
    local_40 = (int *)0x0;
    local_38 = 0x3ff3333333333333;
    newmax = 0;
    iVar8 = iVar1;
    if (iVar1 < 1) {
      iVar8 = 0;
    }
    iVar10 = 1;
    if (0 < iVar1) {
      iVar10 = iVar8;
    }
    spx_alloc<int*>(&local_40,iVar10);
    piVar7 = local_40;
    lVar9 = (long)(set->set).thenum;
    if (0 < lVar9) {
      memset(local_40,0,lVar9 << 2);
    }
    if (0 < n) {
      iVar1 = (addset->set).thenum;
      pIVar2 = (addset->set).theitem;
      pDVar3 = (addset->set).thekey;
      lVar9 = (long)(iVar1 - n);
      newmax = 0;
      do {
        iVar8 = pDVar3[lVar9].idx;
        iVar10 = pIVar2[iVar8].data.super_SVectorBase<double>.memused;
        lVar11 = (long)iVar10;
        if (0 < lVar11) {
          lVar12 = lVar11 + 1;
          piVar13 = &pIVar2[iVar8].data.super_SVectorBase<double>.m_elem[lVar11 + -1].idx;
          do {
            piVar7[*piVar13] = piVar7[*piVar13] + 1;
            lVar12 = lVar12 + -1;
            piVar13 = piVar13 + -4;
          } while (1 < lVar12);
        }
        newmax = newmax + iVar10;
        lVar9 = lVar9 + 1;
      } while (lVar9 < iVar1);
    }
    if ((set->super_ClassArray<soplex::Nonzero<double>_>).themax < newmax) {
      SVSetBase<double>::memRemax(set,newmax);
    }
    lVar9 = (long)(set->set).thenum;
    if (0 < lVar9) {
      lVar9 = lVar9 + 1;
      do {
        pIVar2 = (set->set).theitem + (set->set).thekey[lVar9 + -2].idx;
        iVar1 = (pIVar2->data).super_SVectorBase<double>.memused;
        SVSetBase<double>::xtend(set,(SVectorBase<double> *)pIVar2,piVar7[lVar9 + -2] + iVar1);
        (set->set).theitem[(set->set).thekey[lVar9 + -2].idx].data.super_SVectorBase<double>.memused
             = piVar7[lVar9 + -2] + iVar1;
        piVar7[lVar9 + -2] = iVar1;
        lVar9 = lVar9 + -1;
      } while (1 < lVar9);
    }
    if (0 < n) {
      pIVar2 = (addset->set).theitem;
      pDVar3 = (addset->set).thekey;
      pIVar4 = (set->set).theitem;
      pDVar5 = (set->set).thekey;
      lVar9 = (long)((addset->set).thenum - n);
      do {
        iVar1 = pDVar3[lVar9].idx;
        lVar11 = (long)pIVar2[iVar1].data.super_SVectorBase<double>.memused;
        if (0 < lVar11) {
          lVar12 = lVar11 + 1;
          piVar13 = &pIVar2[iVar1].data.super_SVectorBase<double>.m_elem[lVar11 + -1].idx;
          do {
            iVar1 = *piVar13;
            iVar8 = piVar7[iVar1];
            piVar7[iVar1] = iVar8 + 1;
            pNVar6 = pIVar4[pDVar5[iVar1].idx].data.super_SVectorBase<double>.m_elem;
            pNVar6[iVar8].idx = (int)lVar9;
            pNVar6[iVar8].val = ((Nonzero<double> *)(piVar13 + -2))->val;
            lVar12 = lVar12 + -1;
            piVar13 = piVar13 + -4;
          } while (1 < lVar12);
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < (addset->set).thenum);
    }
    if (local_40 != (int *)0x0) {
      free(local_40);
    }
  }
  return;
}

Assistant:

void added2Set(SVSetBase<R>& set, const SVSetBase<R>& addset, int n)
   {

      if(n == 0)
         return;

      DataArray<int> moreArray(set.num());
      int* more = moreArray.get_ptr();

      for(int i = set.num() - 1; i >= 0; --i)
         more[i] = 0;

      int tot = 0;
      int end = addset.num();

      for(int i = addset.num() - n; i < end; ++i)
      {
         const SVectorBase<R>& vec = addset[i];

         tot += vec.size();

         for(int j = vec.size() - 1; j >= 0; --j)
            more[vec.index(j)]++;
      }

      if(set.memMax() < tot)
         set.memRemax(tot);

      for(int i = set.num() - 1; i >= 0; --i)
      {
         int j = set[i].size();
         set.xtend(set[i], j + more[i]);
         set[i].set_size(j + more[i]);
         more[i] = j;
      }

      for(int i = addset.num() - n; i < addset.num(); ++i)
      {
         const SVectorBase<R>& vec = addset[i];

         for(int j = vec.size() - 1; j >= 0; --j)
         {
            int k = vec.index(j);
            int m = more[k]++;
            SVectorBase<R>& l_xtend = set[k];
            l_xtend.index(m) = i;
            l_xtend.value(m) = vec.value(j);
         }
      }
   }